

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<capnp::Text::Builder&>(String *__return_storage_ptr__,kj *this,Builder *params)

{
  void *__src;
  long lVar1;
  char *__dest;
  size_t __n;
  
  __src = *(void **)(this + 8);
  lVar1 = *(long *)(this + 0x10);
  heapString(__return_storage_ptr__,lVar1 - 1);
  __n = lVar1 - 1;
  if (__n != 0) {
    __dest = (char *)(__return_storage_ptr__->content).size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->content).ptr;
    }
    memcpy(__dest,__src,__n);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}